

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O2

int lws_add_http_header_by_token
              (lws *wsi,lws_token_indexes token,uchar *value,int length,uchar **p,uchar *end)

{
  int iVar1;
  
  iVar1 = lws_wsi_is_h2(wsi);
  if (iVar1 != 0) {
    iVar1 = lws_add_http2_header_by_token(wsi,token,value,length,p,end);
    return iVar1;
  }
  if (_WSI_TOKEN_CLIENT_SENT_PROTOCOLS < token) {
    return 1;
  }
  iVar1 = lws_add_http_header_by_name(wsi,(uchar *)set[token],value,length,p,end);
  return iVar1;
}

Assistant:

int
lws_add_http_header_by_token(struct lws *wsi, enum lws_token_indexes token,
			     const unsigned char *value, int length,
			     unsigned char **p, unsigned char *end)
{
	const unsigned char *name;
#ifdef LWS_WITH_HTTP2
	if (lws_wsi_is_h2(wsi))
		return lws_add_http2_header_by_token(wsi, token, value,
						     length, p, end);
#endif
	name = lws_token_to_string(token);
	if (!name)
		return 1;

	return lws_add_http_header_by_name(wsi, name, value, length, p, end);
}